

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int collect_unknown_extension
              (ptls_t *tls,uint16_t type,uint8_t *src,uint8_t *end,ptls_raw_extension_t *slots)

{
  ptls_iovec_t pVar1;
  uint8_t *local_50;
  size_t local_48;
  ulong local_40;
  size_t i;
  ptls_raw_extension_t *slots_local;
  uint8_t *end_local;
  uint8_t *src_local;
  uint16_t type_local;
  ptls_t *tls_local;
  
  local_40 = 0;
  while( true ) {
    if (slots[local_40].type == 0xffff) {
      if (local_40 < 0x10) {
        slots[local_40].type = type;
        pVar1 = ptls_iovec_init(src,(long)end - (long)src);
        local_50 = pVar1.base;
        slots[local_40].data.base = local_50;
        local_48 = pVar1.len;
        slots[local_40].data.len = local_48;
        slots[local_40 + 1].type = 0xffff;
      }
      return 0;
    }
    if (0xf < local_40) break;
    if (slots[local_40].type == type) {
      return 0x2f;
    }
    local_40 = local_40 + 1;
  }
  __assert_fail("i < MAX_UNKNOWN_EXTENSIONS",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                0xb6a,
                "int collect_unknown_extension(ptls_t *, uint16_t, const uint8_t *, const uint8_t *const, ptls_raw_extension_t *)"
               );
}

Assistant:

static int collect_unknown_extension(ptls_t *tls, uint16_t type, const uint8_t *src, const uint8_t *const end,
                                     ptls_raw_extension_t *slots)
{
    size_t i;
    for (i = 0; slots[i].type != UINT16_MAX; ++i) {
        assert(i < MAX_UNKNOWN_EXTENSIONS);
        if (slots[i].type == type)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
    }
    if (i < MAX_UNKNOWN_EXTENSIONS) {
        slots[i].type = type;
        slots[i].data = ptls_iovec_init(src, end - src);
        slots[i + 1].type = UINT16_MAX;
    }
    return 0;
}